

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O2

int mbedtls_timing_self_test(int verbose)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  unsigned_long uVar5;
  undefined4 extraout_var;
  unsigned_long uVar6;
  uint extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar7;
  undefined4 extraout_var_02;
  ulong uVar8;
  mbedtls_timing_delay_context *ctx_1;
  char *__s;
  ulong uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  mbedtls_timing_delay_context ctx;
  mbedtls_timing_hr_time hires;
  
  if (verbose != 0) {
    puts("  TIMING tests note: will take some time!");
    printf("  TIMING test #1 (set_alarm / get_timer): ");
  }
  mbedtls_timing_get_timer(&hires,1);
  mbedtls_set_alarm(1);
  do {
  } while (mbedtls_timing_alarmed == 0);
  uVar5 = mbedtls_timing_get_timer(&hires,0);
  if (uVar5 - 0x5dd < 0xfffffffffffffd43) {
    if (verbose == 0) {
      return 1;
    }
    printf("failed at line %d\n");
    uVar10 = 0;
    uVar11 = 0;
  }
  else {
    if (verbose != 0) {
      puts("passed");
      printf("  TIMING test #2 (set/get_delay        ): ");
    }
    mbedtls_timing_set_delay(&ctx,800,0x4b0);
    busy_msleep(600);
    iVar3 = mbedtls_timing_get_delay(&ctx);
    if (iVar3 == 0) {
      busy_msleep(300);
      iVar3 = mbedtls_timing_get_delay(&ctx);
      if (iVar3 == 1) {
        busy_msleep(400);
        iVar3 = mbedtls_timing_get_delay(&ctx);
        if (iVar3 == 2) {
          ctx.int_ms = 0;
          ctx.fin_ms = 0;
          busy_msleep(200);
          iVar3 = mbedtls_timing_get_delay(&ctx);
          uVar7 = CONCAT44(extraout_var,iVar3);
          if (iVar3 == -1) {
            if (verbose != 0) {
              puts("passed");
              printf("  TIMING test #3 (hardclock / get_timer): ");
              uVar7 = (ulong)extraout_var_00 << 0x20;
            }
            iVar3 = 0;
            do {
              if (iVar3 == 2) {
                if (verbose != 0) {
                  __s = "failed (ignored)";
LAB_0013ea31:
                  puts(__s);
                  putchar(10);
                }
                return 0;
              }
              uVar8 = rdtsc();
              busy_msleep(1);
              uVar9 = rdtsc();
              uVar9 = (uVar9 & 0xffffffff00000000 | CONCAT44(extraout_var_01,(int)uVar9)) -
                      (uVar8 & 0xffffffff00000000 | CONCAT44((int)(uVar7 >> 0x20),(int)uVar8));
              uVar7 = uVar9 / 5;
              uVar8 = uVar9 - uVar7;
              uVar9 = uVar9 + uVar7;
              uVar5 = 2;
              do {
                if (uVar5 == 5) {
                  if (verbose == 0) {
                    return 0;
                  }
                  __s = "passed";
                  goto LAB_0013ea31;
                }
                uVar1 = rdtsc();
                busy_msleep(uVar5);
                uVar2 = rdtsc();
                uVar7 = ((CONCAT44(extraout_var_02,(int)uVar2) | uVar2 & 0xffffffff00000000) -
                        (uVar1 & 0xffffffff00000000 | CONCAT44((int)(uVar7 >> 0x20),(int)uVar1))) /
                        uVar5;
              } while ((uVar8 <= uVar7) && (uVar5 = uVar5 + 1, uVar7 <= uVar9));
              iVar3 = iVar3 + 1;
            } while( true );
          }
        }
      }
    }
    if (verbose == 0) {
      return 1;
    }
    printf("failed at line %d\n");
    uVar11 = 400;
    uVar10 = 800;
  }
  printf(" cycles=%lu ratio=%lu millisecs=%lu secs=%lu hardfail=%d a=%lu b=%lu\n",0,0,uVar5,1,0,
         uVar10,uVar11);
  uVar5 = mbedtls_timing_get_timer(&hires,0);
  uVar6 = mbedtls_timing_get_timer(&ctx.timer,0);
  uVar4 = mbedtls_timing_get_delay(&ctx);
  printf(" elapsed(hires)=%lu elapsed(ctx)=%lu status(ctx)=%d\n",uVar5,uVar6,(ulong)uVar4);
  return 1;
}

Assistant:

int mbedtls_timing_self_test( int verbose )
{
    unsigned long cycles = 0, ratio = 0;
    unsigned long millisecs = 0, secs = 0;
    int hardfail = 0;
    struct mbedtls_timing_hr_time hires;
    uint32_t a = 0, b = 0;
    mbedtls_timing_delay_context ctx;

    if( verbose != 0 )
        mbedtls_printf( "  TIMING tests note: will take some time!\n" );

    if( verbose != 0 )
        mbedtls_printf( "  TIMING test #1 (set_alarm / get_timer): " );

    {
        secs = 1;

        (void) mbedtls_timing_get_timer( &hires, 1 );

        mbedtls_set_alarm( (int) secs );
        while( !mbedtls_timing_alarmed )
            ;

        millisecs = mbedtls_timing_get_timer( &hires, 0 );

        /* For some reason on Windows it looks like alarm has an extra delay
         * (maybe related to creating a new thread). Allow some room here. */
        if( millisecs < 800 * secs || millisecs > 1200 * secs + 300 )
            FAIL;
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    if( verbose != 0 )
        mbedtls_printf( "  TIMING test #2 (set/get_delay        ): " );

    {
        a = 800;
        b = 400;
        mbedtls_timing_set_delay( &ctx, a, a + b );          /* T = 0 */

        busy_msleep( a - a / 4 );                      /* T = a - a/4 */
        if( mbedtls_timing_get_delay( &ctx ) != 0 )
            FAIL;

        busy_msleep( a / 4 + b / 4 );                  /* T = a + b/4 */
        if( mbedtls_timing_get_delay( &ctx ) != 1 )
            FAIL;

        busy_msleep( b );                          /* T = a + b + b/4 */
        if( mbedtls_timing_get_delay( &ctx ) != 2 )
            FAIL;
    }

    mbedtls_timing_set_delay( &ctx, 0, 0 );
    busy_msleep( 200 );
    if( mbedtls_timing_get_delay( &ctx ) != -1 )
        FAIL;

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    if( verbose != 0 )
        mbedtls_printf( "  TIMING test #3 (hardclock / get_timer): " );

    /*
     * Allow one failure for possible counter wrapping.
     * On a 4Ghz 32-bit machine the cycle counter wraps about once per second;
     * since the whole test is about 10ms, it shouldn't happen twice in a row.
     */

hard_test:
    if( hardfail > 1 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed (ignored)\n" );

        goto hard_test_done;
    }

    /* Get a reference ratio cycles/ms */
    millisecs = 1;
    cycles = mbedtls_timing_hardclock();
    busy_msleep( millisecs );
    cycles = mbedtls_timing_hardclock() - cycles;
    ratio = cycles / millisecs;

    /* Check that the ratio is mostly constant */
    for( millisecs = 2; millisecs <= 4; millisecs++ )
    {
        cycles = mbedtls_timing_hardclock();
        busy_msleep( millisecs );
        cycles = mbedtls_timing_hardclock() - cycles;

        /* Allow variation up to 20% */
        if( cycles / millisecs < ratio - ratio / 5 ||
            cycles / millisecs > ratio + ratio / 5 )
        {
            hardfail++;
            goto hard_test;
        }
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

hard_test_done:

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}